

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool ON_GetPointListBoundingBox
               (int dim,bool is_rat,int count,int stride,double *points,double *boxmin,
               double *boxmax,int bGrowBox)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  bool local_3d;
  int local_3c;
  bool rc;
  int j;
  double w;
  double x;
  double *boxmin_local;
  double *points_local;
  int stride_local;
  int count_local;
  bool is_rat_local;
  int dim_local;
  
  local_3d = false;
  for (local_3c = 0; local_3c < dim && bGrowBox != 0; local_3c = local_3c + 1) {
    if (boxmax[local_3c] <= boxmin[local_3c] && boxmin[local_3c] != boxmax[local_3c]) {
      bGrowBox = 0;
    }
  }
  if (count < 1) {
    local_3d = bGrowBox != 0;
  }
  else {
    stride_local._3_1_ = is_rat;
    if (is_rat) {
      stride_local._3_1_ = 1;
    }
    if (((points != (double *)0x0) && (0 < dim)) &&
       ((count == 1 || ((int)(dim + (uint)(stride_local._3_1_ & 1)) <= stride)))) {
      boxmin_local = points;
      points_local._4_4_ = count;
      if ((stride_local._3_1_ & 1) == 0) {
        local_3d = true;
        if (bGrowBox == 0) {
          memcpy(boxmin,points,(long)dim << 3);
          memcpy(boxmax,boxmin,(long)dim << 3);
          boxmin_local = points + stride;
          points_local._4_4_ = count + -1;
        }
        if (points_local._4_4_ != 0) {
          while (points_local._4_4_ != 0) {
            for (local_3c = 0; local_3c < dim; local_3c = local_3c + 1) {
              dVar1 = boxmin_local[local_3c];
              if (boxmin[local_3c] <= dVar1) {
                if (boxmax[local_3c] < dVar1) {
                  boxmax[local_3c] = dVar1;
                }
              }
              else {
                boxmin[local_3c] = dVar1;
              }
            }
            boxmin_local = boxmin_local + stride;
            points_local._4_4_ = points_local._4_4_ + -1;
          }
        }
      }
      else {
        local_3d = true;
        while( true ) {
          bVar2 = false;
          if (0 < points_local._4_4_) {
            bVar2 = boxmin_local[dim] == 0.0;
          }
          if (!bVar2) break;
          points_local._4_4_ = points_local._4_4_ + -1;
          boxmin_local = boxmin_local + stride;
          local_3d = false;
        }
        if (0 < points_local._4_4_) {
          if (bGrowBox == 0) {
            ON_ArrayScale(dim,1.0 / boxmin_local[dim],boxmin_local,boxmin);
            memcpy(boxmax,boxmin,(long)dim << 3);
            boxmin_local = boxmin_local + stride;
            points_local._4_4_ = points_local._4_4_ + -1;
          }
          if (0 < points_local._4_4_) {
            while (points_local._4_4_ != 0) {
              if ((boxmin_local[dim] != 0.0) || (NAN(boxmin_local[dim]))) {
                dVar1 = boxmin_local[dim];
                for (local_3c = 0; local_3c < dim; local_3c = local_3c + 1) {
                  dVar3 = (1.0 / dVar1) * boxmin_local[local_3c];
                  if (boxmin[local_3c] <= dVar3) {
                    if (boxmax[local_3c] < dVar3) {
                      boxmax[local_3c] = dVar3;
                    }
                  }
                  else {
                    boxmin[local_3c] = dVar3;
                  }
                }
              }
              else {
                local_3d = false;
              }
              boxmin_local = boxmin_local + stride;
              points_local._4_4_ = points_local._4_4_ + -1;
            }
          }
        }
      }
    }
  }
  return local_3d;
}

Assistant:

bool ON_GetPointListBoundingBox( 
    int dim, bool is_rat, int count, int stride, const double* points, 
    double* boxmin, double* boxmax,
    int bGrowBox
    )
/*****************************************************************************
Bounding Box of a set of points
 
INPUT:
  dim           ( >= 1 ) dimension of each point
  is_rat        ( true if points are rational )
  count         ( >= 1 ) number of points
  stride        ( >= (is_rat)?(dim+1):dim )
  points        array of dim*count doubles
  boxmin, boxmax      unused arrays of dim doubles
  bGrowBox       true if input box should be enlarged to contain points
										boxmin[i]>boxmax[i] for some i, represents an empty initial box
                 false if input box should be ignored bounding box of points
                       is returned
OUTPUT:
  boxmin, boxmax      diagonal corners of bounding box
*****************************************************************************/
{
  // OBSOLETE
  // bounding box workhorse
  double x, w;
  int j;
  bool rc = false;
  for ( j = 0; j < dim && bGrowBox; j++ )
  {
    if ( boxmin[j] > boxmax[j] )
      bGrowBox = false;
  }

  if ( count > 0 ) 
  {
    if ( is_rat )
    {
      is_rat = 1;
    }
    if ( points && dim > 0 && (count == 1 || stride >= dim+is_rat) ) 
    {
      // input is valid list of a least 1 point

      if ( is_rat ) 
      {
        // bounding box of homogeneous rational points
        rc = true;
        while ( count > 0 && points[dim] == 0.0 ) 
        {
          count--;
          points += stride;
          rc = false;
        }
        if ( count > 0 ) 
        {
          if ( !bGrowBox  )
          {
            ON_ArrayScale( dim, 1.0/points[dim], points, boxmin );
            memcpy( boxmax, boxmin, dim*sizeof(*boxmax) );
            points += stride;
            count--;
            bGrowBox = true;
          }
          if ( count > 0 ) 
          {
            for ( /*empty*/; count--; points += stride ) 
            {
              if ( points[dim] == 0.0 ) {
                rc = false;
                continue;
              }
              w = 1.0/points[dim];
              for ( j = 0; j < dim; j++ ) 
              {
                x = w*points[j];
                if (boxmin[j] > x) 
                  boxmin[j] = x; 
                else if (boxmax[j] < x) 
                  boxmax[j] = x;
              }
            }
          }
        }
      }
      else 
      {
        // bounding box of non-rational points
        rc = true;
        if ( !bGrowBox ) 
        {
          // use first point to initialize box 
          memcpy( boxmin, points, dim*sizeof(*boxmin) );
          memcpy( boxmax, boxmin, dim*sizeof(*boxmax) );
          points += stride;
          count--;
          bGrowBox = true;
        }
        if ( count ) 
        {
          // grow box to contain the rest of the points
          for ( /*empty*/; count--; points += stride ) 
          {
            for ( j = 0; j < dim; j++ ) 
            {
              x = points[j];
              if (boxmin[j] > x) 
                boxmin[j] = x; 
              else if (boxmax[j] < x) 
                boxmax[j] = x;
            }
          }
        }
      }
    }
  }
  else if ( bGrowBox ) 
  {
    // result is still valid if no points are added to a valid input box
    rc = true;
  }
  return rc;
}